

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

void dmrC_insert_select(dmr_C *C,basic_block *bb,instruction *br,instruction *phi_node,
                       pseudo_t if_true,pseudo_t if_false)

{
  instruction_list **head;
  anon_union_8_2_14638a90_for_instruction_5 aVar1;
  instruction *insn;
  
  head = &bb->insns;
  ptrlist_undo_last((ptr_list **)head);
  insn = alloc_typed_instruction(C,0x25,phi_node->type);
  insn->bb = bb;
  if ((br->field_5).target == (pseudo_t)0x0) {
    __assert_fail("br->cond",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                  ,0x2de,
                  "void dmrC_insert_select(struct dmr_C *, struct basic_block *, struct instruction *, struct instruction *, pseudo_t, pseudo_t)"
                 );
  }
  dmrC_use_pseudo(C,insn,(br->field_5).target,(pseudo_t *)&(insn->field_6).field_0);
  aVar1 = phi_node->field_5;
  if (((aVar1.target)->field_5).sym == (symbol *)phi_node) {
    insn->field_5 = aVar1;
    *(instruction **)((long)aVar1 + 0x20) = insn;
    dmrC_use_pseudo(C,insn,if_true,&(insn->field_6).field_6.src2);
    dmrC_use_pseudo(C,insn,if_false,&(insn->field_6).field_6.src3);
    ptrlist_add((ptr_list **)head,insn,&C->ptrlist_allocator);
    ptrlist_add((ptr_list **)head,br,&C->ptrlist_allocator);
    return;
  }
  __assert_fail("target->def == phi_node",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                ,0x2e2,
                "void dmrC_insert_select(struct dmr_C *, struct basic_block *, struct instruction *, struct instruction *, pseudo_t, pseudo_t)"
               );
}

Assistant:

void dmrC_insert_select(struct dmr_C *C, struct basic_block *bb, struct instruction *br, struct instruction *phi_node, pseudo_t if_true, pseudo_t if_false)
{
	pseudo_t target;
	struct instruction *select;

	/* Remove the 'br' */
	dmrC_delete_last_instruction(&bb->insns);

	select = alloc_typed_instruction(C, OP_SEL, phi_node->type);
	select->bb = bb;

	assert(br->cond);
	dmrC_use_pseudo(C, select, br->cond, &select->src1);

	target = phi_node->target;
	assert(target->def == phi_node);
	select->target = target;
	target->def = select;

	dmrC_use_pseudo(C, select, if_true, &select->src2);
	dmrC_use_pseudo(C, select, if_false, &select->src3);

	dmrC_add_instruction(C, &bb->insns, select);
	dmrC_add_instruction(C, &bb->insns, br);
}